

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                   (Reader *__return_storage_ptr__,PointerReader reader,StructSchema schema)

{
  StructReader reader_00;
  bool bVar1;
  StructReader local_c8;
  Schema local_98;
  Fault local_80;
  Fault f;
  Reader local_48;
  bool local_12;
  DebugExpression<bool> local_11;
  Schema SStack_10;
  DebugExpression<bool> _kjCondition;
  StructSchema schema_local;
  
  SStack_10 = schema.super_Schema.raw;
  Schema::getProto((Reader *)&f,&stack0xfffffffffffffff0);
  capnp::schema::Node::Reader::getStruct(&local_48,(Reader *)&f);
  bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(&local_48);
  local_12 = (bool)((bVar1 ^ 0xffU) & 1);
  local_11 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_12);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_11);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x770,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "_kjCondition,\"Cannot form pointer to group type.\"",&local_11,
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&local_80);
  }
  local_98.raw = SStack_10.raw;
  PointerReader::getStruct(&local_c8,&reader,(word *)0x0);
  reader_00.capTable = local_c8.capTable;
  reader_00.segment = local_c8.segment;
  reader_00.data = local_c8.data;
  reader_00.pointers = local_c8.pointers;
  reader_00.dataSize = local_c8.dataSize;
  reader_00.pointerCount = local_c8.pointerCount;
  reader_00._38_2_ = local_c8._38_2_;
  reader_00.nestingLimit = local_c8.nestingLimit;
  reader_00._44_4_ = local_c8._44_4_;
  DynamicStruct::Reader::Reader(__return_storage_ptr__,(StructSchema)local_98.raw,reader_00);
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Reader PointerHelpers<DynamicStruct, Kind::OTHER>::getDynamic(
    PointerReader reader, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Reader(schema, reader.getStruct(nullptr));
}